

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O1

void cmQtAutoGen::UicMergeOptions
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *baseOpts,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *newOpts,bool isQt5)

{
  int iVar1;
  long lVar2;
  long *plVar3;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  undefined1 *local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  long *local_50 [2];
  long local_40 [2];
  
  if (UicMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
      ::valueOpts_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&UicMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                                 ::valueOpts_abi_cxx11_);
    if (iVar1 != 0) {
      local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"tr","");
      local_d0[0] = local_c0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"translate","");
      local_b0[0] = local_a0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"postfix","");
      local_90[0] = local_80;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_90,"generator","");
      local_70[0] = local_60;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_70,"include","");
      plVar3 = local_40;
      local_50[0] = plVar3;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"g","");
      __l._M_len = 6;
      __l._M_array = &local_f0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&UicMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                ::valueOpts_abi_cxx11_,__l,&local_f1);
      lVar2 = -0xc0;
      do {
        if (plVar3 != (long *)plVar3[-2]) {
          operator_delete((long *)plVar3[-2],*plVar3 + 1);
        }
        plVar3 = plVar3 + -4;
        lVar2 = lVar2 + 0x20;
      } while (lVar2 != 0);
      __cxa_atexit(std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::~vector,
                   &UicMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                    ::valueOpts_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&UicMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                           ::valueOpts_abi_cxx11_);
    }
  }
  MergeOptions(baseOpts,newOpts,
               &UicMergeOptions(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,bool)
                ::valueOpts_abi_cxx11_,isQt5);
  return;
}

Assistant:

void cmQtAutoGen::UicMergeOptions(std::vector<std::string>& baseOpts,
                                  std::vector<std::string> const& newOpts,
                                  bool isQt5)
{
  static std::vector<std::string> const valueOpts = {
    "tr",      "translate", "postfix", "generator",
    "include", // Since Qt 5.3
    "g"
  };
  MergeOptions(baseOpts, newOpts, valueOpts, isQt5);
}